

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stagewise_poly.cc
# Opt level: O0

void synthetic_create(stagewise_poly *poly,example *ec,bool training)

{
  byte bVar1;
  shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar2;
  byte in_DL;
  stagewise_poly *in_RSI;
  example *in_RDI;
  undefined7 unaff_retaddr;
  undefined7 in_stack_ffffffffffffffe8;
  
  bVar1 = in_DL & 1;
  synthetic_reset(in_RSI,(example *)(CONCAT17(in_DL,in_stack_ffffffffffffffe8) & 0x1ffffffffffffff))
  ;
  *(undefined4 *)&in_RDI[1].super_example_predict.feature_space[0].space_names.erase_count = 0;
  *(undefined4 *)&in_RDI[1].super_example_predict.feature_space[0].space_names._begin = 0x3f800000;
  psVar2 = (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)constant_feat_masked(in_RSI);
  in_RDI[1].super_example_predict.feature_space[0].space_names._end = psVar2;
  *(byte *)((long)&in_RDI[1].super_example_predict.feature_space[0].space_names.erase_count + 4) =
       bVar1 & 1;
  GD::foreach_feature<stagewise_poly,_unsigned_long,_&synthetic_create_rec>
            ((vw *)CONCAT17(training,unaff_retaddr),in_RDI,in_RSI);
  synthetic_decycle((stagewise_poly *)CONCAT17(training,unaff_retaddr));
  *(int *)((long)&in_RDI[1].super_example_predict.feature_space[0].indicies._begin + 4) =
       (int)(in_RDI->super_example_predict).feature_space[0x87].space_names.erase_count;
  if ((bVar1 & 1) != 0) {
    (in_RDI->super_example_predict).feature_space[0].values.end_array =
         (float *)((long)in_RDI[1].super_example_predict.feature_space[0].values.end_array +
                  (long)(in_RDI->super_example_predict).feature_space[0].values.end_array);
    (in_RDI->super_example_predict).feature_space[0].values.erase_count =
         (in_RSI->synth_ec).l.cs.costs.erase_count +
         (in_RDI->super_example_predict).feature_space[0].values.erase_count;
    (in_RDI->super_example_predict).feature_space[0].indicies._begin =
         (unsigned_long *)
         ((long)(in_RDI->super_example_predict).feature_space[0].indicies._begin + 1);
  }
  return;
}

Assistant:

void synthetic_create(stagewise_poly &poly, example &ec, bool training)
{
  synthetic_reset(poly, ec);

  poly.cur_depth = 0;

  poly.synth_rec_f.x = 1.0;
  poly.synth_rec_f.weight_index = constant_feat_masked(poly);  // note: not ft_offset'd
  poly.training = training;
  /*
   * Another choice is to mark the constant feature as the single initial
   * parent, and recurse just on that feature (which arguably correctly interprets poly.cur_depth).
   * Problem with this is if there is a collision with the root...
   */
  GD::foreach_feature<stagewise_poly, uint64_t, synthetic_create_rec>(*poly.all, *poly.original_ec, poly);
  synthetic_decycle(poly);
  poly.synth_ec.total_sum_feat_sq = poly.synth_ec.feature_space[tree_atomics].sum_feat_sq;

  if (training)
  {
    poly.sum_sparsity += poly.synth_ec.num_features;
    poly.sum_input_sparsity += ec.num_features;
    poly.num_examples += 1;
  }
}